

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallScriptGenerator::Compute(cmInstallScriptGenerator *this,cmLocalGenerator *lg)

{
  cmLocalGenerator *this_00;
  PolicyStatus PVar1;
  PolicyID id;
  string local_38;
  cmLocalGenerator *local_18;
  cmLocalGenerator *lg_local;
  cmInstallScriptGenerator *this_local;
  
  this->LocalGenerator = lg;
  if ((((this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig & 1U) != 0) &&
     (local_18 = lg, lg_local = (cmLocalGenerator *)this,
     PVar1 = cmLocalGenerator::GetPolicyStatus(this->LocalGenerator,CMP0087), PVar1 != OLD)) {
    if (PVar1 == WARN) {
      this_00 = this->LocalGenerator;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_38,(cmPolicies *)0x57,id);
      cmLocalGenerator::IssueMessage(this_00,AUTHOR_WARNING,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    else if (PVar1 - NEW < 3) {
      this->AllowGenex = true;
    }
  }
  return;
}

Assistant:

void cmInstallScriptGenerator::Compute(cmLocalGenerator* lg)
{
  this->LocalGenerator = lg;

  if (this->ActionsPerConfig) {
    switch (this->LocalGenerator->GetPolicyStatus(cmPolicies::CMP0087)) {
      case cmPolicies::WARN:
        this->LocalGenerator->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0087));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        this->AllowGenex = true;
        break;
    }
  }
}